

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::TestSuite::Run(TestSuite *this)

{
  bool bVar1;
  int iVar2;
  TestEventListeners *this_00;
  TestEventListener *pTVar3;
  iterator iVar4;
  iterator iVar5;
  TimeInMillis TVar6;
  TestInfo *this_01;
  TestSuite *in_RDI;
  char *in_stack_00000008;
  offset_in_TestSuite_to_subr in_stack_00000010;
  TestInfo *in_stack_00000020;
  int j;
  int i;
  Timer timer;
  bool skip_all;
  TestEventListener *repeater;
  vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int iVar7;
  undefined4 in_stack_ffffffffffffff84;
  TestResult *this_02;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar8;
  UnitTest *in_stack_ffffffffffffffa0;
  code *this_03;
  int local_50;
  int local_4c;
  undefined7 in_stack_ffffffffffffffc0;
  byte bVar9;
  
  if ((in_RDI->should_run_ & 1U) == 0) {
    return;
  }
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite(in_stack_ffffffffffffffa0,in_RDI);
  UnitTest::GetInstance();
  this_00 = UnitTest::listeners((UnitTest *)0x14c2d6);
  pTVar3 = TestEventListeners::repeater(this_00);
  this_02 = (TestResult *)&in_RDI->test_info_list_;
  iVar4 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::begin
                    (in_stack_ffffffffffffff78);
  iVar5 = std::vector<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>::end
                    (in_stack_ffffffffffffff78);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<testing::TestInfo**,std::vector<testing::TestInfo*,std::allocator<testing::TestInfo*>>>,testing::TestSuite::Run()::__0>
            (iVar4._M_current,iVar5._M_current);
  (*pTVar3->_vptr_TestEventListener[6])(pTVar3,in_RDI);
  (*pTVar3->_vptr_TestEventListener[7])(pTVar3,in_RDI);
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest((UnitTest *)0x14c34c);
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000020,in_stack_00000010,in_stack_00000008);
  ad_hoc_test_result(in_RDI);
  bVar1 = TestResult::Failed(this_02);
  uVar8 = true;
  if (!bVar1) {
    ad_hoc_test_result(in_RDI);
    uVar8 = TestResult::Skipped((TestResult *)
                                CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  bVar9 = uVar8;
  TVar6 = internal::GetTimeInMillis();
  in_RDI->start_timestamp_ = TVar6;
  internal::Timer::Timer((Timer *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  local_4c = 0;
  while (iVar7 = local_4c, iVar2 = total_test_count((TestSuite *)0x14c3f0), iVar7 < iVar2) {
    iVar7 = (int)((ulong)this_02 >> 0x20);
    if ((bVar9 & 1) == 0) {
      GetMutableTestInfo((TestSuite *)CONCAT17(uVar8,in_stack_ffffffffffffff90),iVar7);
      TestInfo::Run((TestInfo *)CONCAT17(bVar9,in_stack_ffffffffffffffc0));
    }
    else {
      GetMutableTestInfo((TestSuite *)CONCAT17(uVar8,in_stack_ffffffffffffff90),iVar7);
      TestInfo::Skip(in_stack_00000020);
    }
    if ((FLAGS_gtest_fail_fast & 1) != 0) {
      this_01 = GetMutableTestInfo((TestSuite *)CONCAT17(uVar8,in_stack_ffffffffffffff90),
                                   (int)((ulong)this_02 >> 0x20));
      TestInfo::result(this_01);
      bVar1 = TestResult::Failed(this_02);
      local_50 = local_4c;
      if (bVar1) goto LAB_0014c46b;
    }
    local_4c = local_4c + 1;
  }
LAB_0014c4be:
  TVar6 = internal::Timer::Elapsed((Timer *)CONCAT17(uVar8,in_stack_ffffffffffffff90));
  in_RDI->elapsed_time_ = TVar6;
  UnitTest::GetInstance();
  UnitTest::UponLeavingGTest((UnitTest *)0x14c4e4);
  this_03 = RunTearDownTestSuite;
  internal::HandleExceptionsInMethodIfSupported<testing::TestSuite,void>
            ((TestSuite *)in_stack_00000020,in_stack_00000010,in_stack_00000008);
  (*pTVar3->_vptr_TestEventListener[0xc])(pTVar3,in_RDI);
  (*pTVar3->_vptr_TestEventListener[0xd])(pTVar3,in_RDI);
  UnitTest::GetInstance();
  UnitTest::set_current_test_suite((UnitTest *)this_03,in_RDI);
  return;
LAB_0014c46b:
  while( true ) {
    local_50 = local_50 + 1;
    iVar7 = local_50;
    iVar2 = total_test_count((TestSuite *)0x14c47d);
    if (iVar2 <= iVar7) break;
    GetMutableTestInfo((TestSuite *)CONCAT17(uVar8,in_stack_ffffffffffffff90),
                       (int)((ulong)this_02 >> 0x20));
    TestInfo::Skip(in_stack_00000020);
  }
  goto LAB_0014c4be;
}

Assistant:

void TestSuite::Run() {
  if (!should_run_) return;

  UnitTest::GetInstance()->set_current_test_suite(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Ensure our tests are in a deterministic order.
  //
  // We do this by sorting lexicographically on (file, line number), providing
  // an order matching what the user can see in the source code.
  //
  // In the common case the line number comparison shouldn't be necessary,
  // because the registrations made by the TEST macro are executed in order
  // within a translation unit. But this is not true of the manual registration
  // API, and in more exotic scenarios a single file may be part of multiple
  // translation units.
  std::stable_sort(test_info_list_.begin(), test_info_list_.end(),
                   [](const TestInfo* const a, const TestInfo* const b) {
                     if (const int result = std::strcmp(a->file(), b->file())) {
                       return result < 0;
                     }

                     return a->line() < b->line();
                   });

  // Call both legacy and the new API
  repeater->OnTestSuiteStart(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseStart(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunSetUpTestSuite, "SetUpTestSuite()");

  const bool skip_all =
      ad_hoc_test_result().Failed() || ad_hoc_test_result().Skipped();

  start_timestamp_ = internal::GetTimeInMillis();
  internal::Timer timer;
  for (int i = 0; i < total_test_count(); i++) {
    if (skip_all) {
      GetMutableTestInfo(i)->Skip();
    } else {
      GetMutableTestInfo(i)->Run();
    }
    if (GTEST_FLAG_GET(fail_fast) &&
        GetMutableTestInfo(i)->result()->Failed()) {
      for (int j = i + 1; j < total_test_count(); j++) {
        GetMutableTestInfo(j)->Skip();
      }
      break;
    }
  }
  elapsed_time_ = timer.Elapsed();

  UnitTest::GetInstance()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      this, &TestSuite::RunTearDownTestSuite, "TearDownTestSuite()");

  // Call both legacy and the new API
  repeater->OnTestSuiteEnd(*this);
//  Legacy API is deprecated but still available
#ifndef GTEST_REMOVE_LEGACY_TEST_CASEAPI_
  repeater->OnTestCaseEnd(*this);
#endif  //  GTEST_REMOVE_LEGACY_TEST_CASEAPI_

  UnitTest::GetInstance()->set_current_test_suite(nullptr);
}